

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool P_UseTraverse(AActor *usething,DVector2 *start,DVector2 *end,bool *foundline)

{
  line_t *plVar1;
  AActor *thing;
  sector_t *psVar2;
  ASectorAction *pAVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  intercept_t *in;
  DVector3 xpos;
  FPathTraverse it;
  FLineOpening open;
  DVector3 local_130;
  FSoundID local_114;
  DVector2 local_110;
  FPathTraverse local_100;
  FLineOpening local_c0;
  
  local_100._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_0084b268;
  FPathTraverse::init(&local_100,(EVP_PKEY_CTX *)0x3);
  local_130.X = start->X;
  local_130.Y = start->Y;
  local_130.Z = (usething->__Pos).Z;
  do {
    while( true ) {
      do {
        while( true ) {
          in = FPathTraverse::Next(&local_100);
          if (in == (intercept_t *)0x0) goto LAB_005158c2;
          if (in->isaline != false) break;
          thing = (in->d).thing;
          if ((thing != usething) &&
             (((((thing->flags5).Value & 0x2000) != 0 || (thing->special == 0x81)) &&
              (bVar5 = P_ActivateThingSpecial(thing,usething,false), bVar5)))) goto LAB_005158c2;
        }
        iVar6 = FPathTraverse::PortalRelocate(&local_100,in,3,&local_130);
      } while (iVar6 != 0);
      plVar1 = (in->d).line;
      if ((plVar1->special != 0) && ((plVar1->activation & 0x442) != 0)) break;
LAB_005156d0:
      if ((((in->d).line)->flags & 0x2008000) == 0) {
        local_110.X = local_100.trace.dx * in->frac + local_100.trace.x;
        local_110.Y = in->frac * local_100.trace.dy + local_100.trace.y;
        P_LineOpening(&local_c0,(AActor *)0x0,(in->d).line,&local_110,(DVector2 *)0x0,0);
      }
      else {
        local_c0.range = 0.0;
      }
      if ((local_c0.range <= 0.0) ||
         ((((in->d).line)->special != 0 && ((i_compatflags & 0x100U) != 0)))) {
        psVar2 = usething->Sector;
        pAVar3 = (psVar2->SecActTarget).field_0.p;
        if (pAVar3 != (ASectorAction *)0x0) {
          if (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
            bVar5 = ASectorAction::TriggerAction((psVar2->SecActTarget).field_0.p,usething,0x10);
            if (bVar5) goto LAB_005158c2;
          }
          else {
            (psVar2->SecActTarget).field_0.p = (ASectorAction *)0x0;
          }
        }
        plVar1 = (in->d).line;
        if (((byte)i_compatflags2 & 8) == 0) {
          uVar7 = (uint)(1.52587890625e-05 <
                        ((plVar1->v1->p).X - local_130.X) * (plVar1->delta).Y +
                        (local_130.Y - (plVar1->v1->p).Y) * (plVar1->delta).X);
        }
        else {
          uVar7 = P_VanillaPointOnLineSide(local_130.X,local_130.Y,plVar1);
        }
        dVar4 = (&((in->d).thing)->SpriteAngle)[uVar7 != 0].Degrees;
        if ((dVar4 != 0.0) && (*(long *)((long)dVar4 + 0x1e8) != 0)) {
          if ((*(byte *)(*(long *)((long)dVar4 + 0x1e8) + 0x20) & 0x20) == 0) {
            bVar5 = ASectorAction::TriggerAction
                              (*(ASectorAction **)((long)dVar4 + 0x1e8),usething,0x20);
            if (bVar5) goto LAB_005158c2;
          }
          else {
            *(undefined8 *)((long)dVar4 + 0x1e8) = 0;
          }
        }
        if (usething->player != (player_t *)0x0) {
          local_114.ID = S_FindSound("*usefail");
          S_Sound(usething,2,&local_114,1.0,1.001);
        }
        goto LAB_005158c2;
      }
      *foundline = true;
    }
    if (((byte)i_compatflags2 & 8) == 0) {
      uVar7 = (uint)(1.52587890625e-05 <
                    ((plVar1->v1->p).X - local_130.X) * (plVar1->delta).Y +
                    (local_130.Y - (plVar1->v1->p).Y) * (plVar1->delta).X);
    }
    else {
      uVar7 = P_VanillaPointOnLineSide(local_130.X,local_130.Y,plVar1);
    }
    plVar1 = (in->d).line;
    if (uVar7 == 1) {
      if ((plVar1->activation >> 10 & 1) == 0) goto LAB_005156d0;
      P_ActivateLine(plVar1,usething,1,0x400,&local_130);
      break;
    }
    if ((plVar1->activation & 0x442) == 0x400) goto LAB_005156d0;
    P_ActivateLine(plVar1,usething,0,2,&local_130);
    uVar7 = ((in->d).line)->activation;
    bVar5 = (uVar7 & 2) == 0;
    if (((uint)i_compatflags >> 8 & 1) != 0) {
      bVar5 = SUB41((uVar7 & 0x40) >> 6,0);
    }
  } while (bVar5 != false);
LAB_005158c2:
  FPathTraverse::~FPathTraverse(&local_100);
  return in != (intercept_t *)0x0;
}

Assistant:

bool P_UseTraverse(AActor *usething, const DVector2 &start, const DVector2 &end, bool &foundline)
{
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES | PT_ADDTHINGS);
	intercept_t *in;
	DVector3 xpos = { start.X, start.Y, usething->Z() };

	while ((in = it.Next()))
	{
		// [RH] Check for things to talk with or use a puzzle item on
		if (!in->isaline)
		{
			if (usething == in->d.thing)
				continue;
			// Check thing

			// Check for puzzle item use or USESPECIAL flag
			// Extended to use the same activationtype mechanism as BUMPSPECIAL does
			if (in->d.thing->flags5 & MF5_USESPECIAL || in->d.thing->special == UsePuzzleItem)
			{
				if (P_ActivateThingSpecial(in->d.thing, usething))
					return true;
			}
			continue;
		}

		if (it.PortalRelocate(in, PT_ADDLINES | PT_ADDTHINGS, &xpos))
		{
			continue;
		}

		FLineOpening open;
		if (in->d.line->special == 0 || !(in->d.line->activation & (SPAC_Use | SPAC_UseThrough | SPAC_UseBack)))
		{
		blocked:
			if (in->d.line->flags & (ML_BLOCKEVERYTHING | ML_BLOCKUSE))
			{
				open.range = 0;
			}
			else
			{
				P_LineOpening(open, NULL, in->d.line, it.InterceptPoint(in));
			}
			if (open.range <= 0 ||
				(in->d.line->special != 0 && (i_compatflags & COMPATF_USEBLOCKING)))
			{
				// [RH] Give sector a chance to intercept the use

				sector_t * sec;

				sec = usething->Sector;

				if (sec->SecActTarget && sec->SecActTarget->TriggerAction(usething, SECSPAC_Use))
				{
					return true;
				}

				sec = P_PointOnLineSide(xpos, in->d.line) == 0 ?
					in->d.line->frontsector : in->d.line->backsector;

				if (sec != NULL && sec->SecActTarget &&
					sec->SecActTarget->TriggerAction(usething, SECSPAC_UseWall))
				{
					return true;
				}

				if (usething->player)
				{
					S_Sound(usething, CHAN_VOICE, "*usefail", 1, ATTN_IDLE);
				}
				return true;		// can't use through a wall
			}
			foundline = true;
			continue;			// not a special line, but keep checking
		}

		if (P_PointOnLineSide(xpos, in->d.line) == 1)
		{
			if (!(in->d.line->activation & SPAC_UseBack))
			{
				// [RH] continue traversal for two-sided lines
				//return in->d.line->backsector != NULL;		// don't use back side
				goto blocked;	// do a proper check for back sides of triggers
			}
			else
			{
				P_ActivateLine(in->d.line, usething, 1, SPAC_UseBack, &xpos);
				return true;
			}
		}
		else
		{
			if ((in->d.line->activation & (SPAC_Use | SPAC_UseThrough | SPAC_UseBack)) == SPAC_UseBack)
			{
				goto blocked; // Line cannot be used from front side so treat it as a non-trigger line
			}

			P_ActivateLine(in->d.line, usething, 0, SPAC_Use, &xpos);

			//WAS can't use more than one special line in a row
			//jff 3/21/98 NOW multiple use allowed with enabling line flag
			//[RH] And now I've changed it again. If the line is of type
			//	   SPAC_USE, then it eats the use. Everything else passes
			//	   it through, including SPAC_USETHROUGH.
			if (i_compatflags & COMPATF_USEBLOCKING)
			{
				if (in->d.line->activation & SPAC_UseThrough) continue;
				else return true;
			}
			else
			{
				if (!(in->d.line->activation & SPAC_Use)) continue;
				else return true;
			}

		}

	}
	return false;
}